

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_initialize.c
# Opt level: O3

lu_int basiclu_initialize(lu_int m,lu_int *istore,double *xstore)

{
  lu_int lVar1;
  
  lVar1 = -3;
  if (xstore != (double *)0x0 && istore != (lu_int *)0x0) {
    if (m < 1) {
      return -4;
    }
    lu_initialize(m,istore,xstore);
    lVar1 = 0;
  }
  return lVar1;
}

Assistant:

lu_int basiclu_initialize
(
    lu_int m,
    lu_int istore[],
    double xstore[]
)
{
    if (!istore || !xstore)
        return BASICLU_ERROR_argument_missing;
    if (m <= 0)
        return BASICLU_ERROR_invalid_argument;

    lu_initialize(m, istore, xstore);
    return BASICLU_OK;
}